

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_SendMessageDisposition
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_MESSAGE_HANDLE message_handle,
          IOTHUBMESSAGE_DISPOSITION_RESULT disposition)

{
  IOTHUB_MESSAGE_RESULT IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  DEVICE_MESSAGE_DISPOSITION_RESULT disposition_result;
  IOTHUB_CLIENT_RESULT IVar4;
  char *pcVar5;
  MESSAGE_DISPOSITION_CONTEXT_HANDLE device_message_disposition_info;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  DEVICE_MESSAGE_DISPOSITION_INFO *local_28;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0 || message_handle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_0012fb12:
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
      goto LAB_0012fbc4;
    }
    pcVar5 = "Failed sending message disposition (handle=%p, message_handle=%p)";
    IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0x8e5;
  }
  else {
    IVar1 = IoTHubMessage_GetDispositionContext
                      (message_handle,(MESSAGE_DISPOSITION_CONTEXT_HANDLE *)&local_28);
    if ((IVar1 == IOTHUB_MESSAGE_OK) && (local_28 != (DEVICE_MESSAGE_DISPOSITION_INFO *)0x0)) {
      if (disposition < IOTHUBMESSAGE_ASYNC_ACK) {
        disposition_result = disposition + DEVICE_MESSAGE_DISPOSITION_RESULT_ACCEPTED;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        disposition_result = DEVICE_MESSAGE_DISPOSITION_RESULT_RELEASED;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"get_device_disposition_result_from",0x193,1,
                    "Failed getting corresponding DEVICE_MESSAGE_DISPOSITION_RESULT for IOTHUBMESSAGE_DISPOSITION_RESULT (%d is not supported)"
                    ,CONCAT44(uVar6,disposition));
        }
      }
      iVar2 = amqp_device_send_message_disposition
                        (*(AMQP_DEVICE_HANDLE *)((long)handle + 8),local_28,disposition_result);
      if (iVar2 == 0) {
        IVar4 = IOTHUB_CLIENT_OK;
        goto LAB_0012fbc4;
      }
      STRING_c_str(*handle);
      p_Var3 = xlogging_get_log_function();
      IVar4 = IOTHUB_CLIENT_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012fbc4;
      pcVar5 = 
      "Device \'%s\' failed sending message disposition (amqp_device_send_message_disposition failed)"
      ;
      iVar2 = 0x8fb;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012fb12;
      pcVar5 = "Invalid message handle (no disposition context found)";
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
      iVar2 = 0x8ef;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
            ,"IoTHubTransport_AMQP_Common_SendMessageDisposition",iVar2,1,pcVar5);
LAB_0012fbc4:
  IoTHubMessage_Destroy(message_handle);
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_SendMessageDisposition(IOTHUB_DEVICE_HANDLE handle, IOTHUB_MESSAGE_HANDLE message_handle, IOTHUBMESSAGE_DISPOSITION_RESULT disposition)
{
    IOTHUB_CLIENT_RESULT result;
    if (message_handle == NULL || handle == NULL)
    {
        LogError("Failed sending message disposition (handle=%p, message_handle=%p)", handle, message_handle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        MESSAGE_DISPOSITION_CONTEXT_HANDLE device_message_disposition_info;

        if (IoTHubMessage_GetDispositionContext(message_handle, &device_message_disposition_info) != IOTHUB_MESSAGE_OK ||
            device_message_disposition_info == NULL)
        {
            LogError("Invalid message handle (no disposition context found)");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else
        {
            AMQP_TRANSPORT_DEVICE_INSTANCE* amqp_device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

            DEVICE_MESSAGE_DISPOSITION_RESULT device_disposition_result = get_device_disposition_result_from(disposition);

            if (amqp_device_send_message_disposition(amqp_device_instance->device_handle, (DEVICE_MESSAGE_DISPOSITION_INFO*)device_message_disposition_info, device_disposition_result) != RESULT_OK)
            {
                const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
                LogError("Device '%s' failed sending message disposition (amqp_device_send_message_disposition failed)", MU_P_OR_NULL(device_id));
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
    }

    IoTHubMessage_Destroy(message_handle);

    return result;
}